

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O1

void __thiscall CCamCal::outTxt(CCamCal *this)

{
  long lVar1;
  FILE *__stream;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 *puVar5;
  Mat local_e8 [8];
  Mat oCalIntMat;
  undefined8 *local_d8;
  long *local_a0;
  uint local_88 [2];
  Mat oCalDistCoeffMat;
  int local_7c;
  undefined8 *local_78;
  int *local_48;
  long *local_40;
  
  __stream = fopen((this->m_oCfg).m_acOutCamMatPth,"w");
  puVar5 = *(undefined8 **)&this->field_0x508;
  lVar1 = **(long **)&this->field_0x540;
  fprintf(__stream,
          "Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
          *puVar5,puVar5[1],puVar5[2],*(undefined8 *)((long)puVar5 + lVar1),
          *(undefined8 *)((long)puVar5 + lVar1 + 8),*(undefined8 *)((long)puVar5 + lVar1 + 0x10),
          *(undefined8 *)((long)puVar5 + lVar1 * 2),*(undefined8 *)((long)puVar5 + lVar1 * 2 + 8));
  puVar5 = *(undefined8 **)&this->field_0x508;
  lVar1 = **(long **)&this->field_0x540;
  printf("Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
         *puVar5,puVar5[1],puVar5[2],*(undefined8 *)((long)puVar5 + lVar1),
         *(undefined8 *)((long)puVar5 + lVar1 + 8),*(undefined8 *)((long)puVar5 + lVar1 + 0x10),
         *(undefined8 *)((long)puVar5 + lVar1 * 2),*(undefined8 *)((long)puVar5 + lVar1 * 2 + 8));
  if ((this->m_oCfg).m_bCalDistFlg == true) {
    cv::Mat::Mat(local_e8,&(this->m_oCfg).m_oCalIntMat);
    lVar1 = *local_a0;
    fprintf(__stream,
            "Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n"
            ,*local_d8,local_d8[1],local_d8[2],*(undefined8 *)((long)local_d8 + lVar1),
            *(undefined8 *)((long)local_d8 + lVar1 + 8),
            *(undefined8 *)((long)local_d8 + lVar1 + 0x10),
            *(undefined8 *)((long)local_d8 + lVar1 * 2),
            *(undefined8 *)((long)local_d8 + lVar1 * 2 + 8));
    lVar1 = *local_a0;
    printf("Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n"
           ,*local_d8,local_d8[1],local_d8[2],*(undefined8 *)((long)local_d8 + lVar1),
           *(undefined8 *)((long)local_d8 + lVar1 + 8),
           *(undefined8 *)((long)local_d8 + lVar1 + 0x10),
           *(undefined8 *)((long)local_d8 + lVar1 * 2),
           *(undefined8 *)((long)local_d8 + lVar1 * 2 + 8));
    cv::Mat::Mat((Mat *)local_88,&(this->m_oCfg).m_oCalDistCoeffMat);
    if (((local_88[0] >> 0xe & 1) == 0) && (*local_48 != 1)) {
      if (local_48[1] == 1) {
        puVar5 = (undefined8 *)((long)local_78 + *local_40);
      }
      else {
        iVar4 = 0;
        if (local_7c + 1U < 3) {
          iVar4 = local_7c;
        }
        puVar5 = (undefined8 *)
                 ((long)local_78 + (long)(1 - local_7c * iVar4) * 8 + (long)iVar4 * *local_40);
      }
    }
    else {
      puVar5 = local_78 + 1;
    }
    if (((local_88[0] >> 0xe & 1) == 0) && (*local_48 != 1)) {
      if (local_48[1] == 1) {
        puVar2 = (undefined8 *)(*local_40 * 2 + (long)local_78);
      }
      else {
        puVar2 = (undefined8 *)
                 ((long)local_78 +
                 (2 % (long)local_7c & 0xffffffffU) * 8 +
                 (long)(int)(2 / (long)local_7c) * *local_40);
      }
    }
    else {
      puVar2 = local_78 + 2;
    }
    if (((local_88[0] >> 0xe & 1) == 0) && (*local_48 != 1)) {
      if (local_48[1] == 1) {
        puVar3 = (undefined8 *)(*local_40 * 3 + (long)local_78);
      }
      else {
        puVar3 = (undefined8 *)
                 ((long)local_78 +
                 (3 % (long)local_7c & 0xffffffffU) * 8 +
                 (long)(int)(3 / (long)local_7c) * *local_40);
      }
    }
    else {
      puVar3 = local_78 + 3;
    }
    fprintf(__stream,"Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",*local_78,*puVar5,
            *puVar2,*puVar3);
    if (((local_88[0] >> 0xe & 1) == 0) && (*local_48 != 1)) {
      if (local_48[1] == 1) {
        puVar5 = (undefined8 *)((long)local_78 + *local_40);
      }
      else {
        iVar4 = 0;
        if (local_7c + 1U < 3) {
          iVar4 = local_7c;
        }
        puVar5 = (undefined8 *)
                 ((long)local_78 + (long)(1 - local_7c * iVar4) * 8 + (long)iVar4 * *local_40);
      }
    }
    else {
      puVar5 = local_78 + 1;
    }
    if (((local_88[0] >> 0xe & 1) == 0) && (*local_48 != 1)) {
      if (local_48[1] == 1) {
        puVar2 = (undefined8 *)(*local_40 * 2 + (long)local_78);
      }
      else {
        puVar2 = (undefined8 *)
                 ((long)local_78 +
                 (2 % (long)local_7c & 0xffffffffU) * 8 +
                 (long)(int)(2 / (long)local_7c) * *local_40);
      }
    }
    else {
      puVar2 = local_78 + 2;
    }
    if (((local_88[0] >> 0xe & 1) == 0) && (*local_48 != 1)) {
      if (local_48[1] == 1) {
        puVar3 = (undefined8 *)(*local_40 * 3 + (long)local_78);
      }
      else {
        puVar3 = (undefined8 *)
                 ((long)local_78 +
                 (3 % (long)local_7c & 0xffffffffU) * 8 +
                 (long)(int)(3 / (long)local_7c) * *local_40);
      }
    }
    else {
      puVar3 = local_78 + 3;
    }
    printf("Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",*local_78,*puVar5,*puVar2,
           *puVar3);
    cv::Mat::~Mat((Mat *)local_88);
    cv::Mat::~Mat(local_e8);
  }
  fprintf(__stream,"Reprojection error: %.15lf\n",this->m_fReprojErr);
  printf("Reprojection error: %.15lf\n",this->m_fReprojErr);
  fclose(__stream);
  return;
}

Assistant:

void CCamCal::outTxt(void)
{
	FILE* pfHomoMat = std::fopen(m_oCfg.getOutCamMatPth(), "w");

	std::fprintf(pfHomoMat, "Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
		m_oHomoMat.at<double>(0, 0), m_oHomoMat.at<double>(0, 1), m_oHomoMat.at<double>(0, 2),
		m_oHomoMat.at<double>(1, 0), m_oHomoMat.at<double>(1, 1), m_oHomoMat.at<double>(1, 2),
		m_oHomoMat.at<double>(2, 0), m_oHomoMat.at<double>(2, 1), m_oHomoMat.at<double>(2, 2));
	std::printf("Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
		m_oHomoMat.at<double>(0, 0), m_oHomoMat.at<double>(0, 1), m_oHomoMat.at<double>(0, 2),
		m_oHomoMat.at<double>(1, 0), m_oHomoMat.at<double>(1, 1), m_oHomoMat.at<double>(1, 2),
		m_oHomoMat.at<double>(2, 0), m_oHomoMat.at<double>(2, 1), m_oHomoMat.at<double>(2, 2));

	if (m_oCfg.getCalDistFlg())
	{
	    cv::Mat oCalIntMat = m_oCfg.getCalIntMat();
	    std::fprintf(pfHomoMat, "Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
            	oCalIntMat.at<double>(0, 0), oCalIntMat.at<double>(0, 1), oCalIntMat.at<double>(0, 2),
            	oCalIntMat.at<double>(1, 0), oCalIntMat.at<double>(1, 1), oCalIntMat.at<double>(1, 2),
            	oCalIntMat.at<double>(2, 0), oCalIntMat.at<double>(2, 1), oCalIntMat.at<double>(2, 2));
	    std::printf("Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
            	oCalIntMat.at<double>(0, 0), oCalIntMat.at<double>(0, 1), oCalIntMat.at<double>(0, 2),
            	oCalIntMat.at<double>(1, 0), oCalIntMat.at<double>(1, 1), oCalIntMat.at<double>(1, 2),
            	oCalIntMat.at<double>(2, 0), oCalIntMat.at<double>(2, 1), oCalIntMat.at<double>(2, 2));

		cv::Mat oCalDistCoeffMat = m_oCfg.getCalDistCoeffMat();
		std::fprintf(pfHomoMat, "Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",
			oCalDistCoeffMat.at<double>(0), oCalDistCoeffMat.at<double>(1),
			oCalDistCoeffMat.at<double>(2), oCalDistCoeffMat.at<double>(3));
		std::printf("Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",
			oCalDistCoeffMat.at<double>(0), oCalDistCoeffMat.at<double>(1),
			oCalDistCoeffMat.at<double>(2), oCalDistCoeffMat.at<double>(3));
	}

	std::fprintf(pfHomoMat, "Reprojection error: %.15lf\n", m_fReprojErr);
	std::printf("Reprojection error: %.15lf\n", m_fReprojErr);

	std::fclose(pfHomoMat);
}